

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool_test.cpp
# Opt level: O0

int main(void)

{
  time_t startTime_00;
  CallFunc local_158;
  int local_138;
  int i;
  undefined1 local_128 [8];
  ThreadPool threadPool;
  TimeAlloc timeCnt;
  time_t startTime;
  
  startTime_00 = time((time_t *)0x0);
  TimeAlloc::TimeAlloc
            ((TimeAlloc *)
             &threadPool.m_tasks.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node,startTime_00);
  ThreadPool::ThreadPool((ThreadPool *)local_128,100);
  ThreadPool::Start((ThreadPool *)local_128,2);
  for (local_138 = 0; local_138 < 10000; local_138 = local_138 + 1) {
    std::function<void()>::function<void(&)(),void>((function<void()> *)&local_158,SayHelloWorld);
    ThreadPool::Run((ThreadPool *)local_128,&local_158);
    std::function<void_()>::~function(&local_158);
  }
  ThreadPool::~ThreadPool((ThreadPool *)local_128);
  TimeAlloc::~TimeAlloc
            ((TimeAlloc *)
             &threadPool.m_tasks.
              super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node);
  return 0;
}

Assistant:

int main()
{
	time_t startTime = time(NULL);
	TimeAlloc timeCnt(startTime);
	
	ThreadPool threadPool(100);
	threadPool.Start(2);
	for (int i = 0; i < 10000; ++i)
	{
		threadPool.Run(SayHelloWorld);
	}
}